

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void wasm::
     CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
     ::doEndIf(CFGBuilder *self,Expression **currp)

{
  CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
  *this;
  long lVar1;
  char *__to;
  char *__to_00;
  
  this = (CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          *)(self->
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            ).currBasicBlock;
  startBasicBlock(&self->
                   super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 );
  link(this,(char *)(self->
                    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                    ).currBasicBlock,__to);
  if ((*currp)->_id == IfId) {
    lVar1 = *(long *)(*currp + 2);
    link((CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          *)(self->
            super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            ).ifLastBlockStack.
            super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1],
         (char *)(self->
                 super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                 ).currBasicBlock,__to_00);
    (self->
    super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ).ifLastBlockStack.
    super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (self->
         super_CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
         ).ifLastBlockStack.
         super__Vector_base<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*,_std::allocator<wasm::CFGWalker<CFGBuilder,_wasm::UnifiedExpressionVisitor<CFGBuilder,_void>,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>::BasicBlock_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + ((ulong)(lVar1 == 0) - 2);
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::If]");
}

Assistant:

static void doEndIf(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    // last one is ifFalse's fallthrough if there was one, otherwise it's the
    // ifTrue fallthrough
    self->link(last, self->currBasicBlock);
    if ((*currp)->cast<If>()->ifFalse) {
      // we just linked ifFalse, need to link ifTrue to the end
      self->link(self->ifLastBlockStack.back(), self->currBasicBlock);
      self->ifLastBlockStack.pop_back();
    } else {
      // no ifFalse, so add a fallthrough for if the if is not taken
      self->link(self->ifLastBlockStack.back(), self->currBasicBlock);
    }
    self->ifLastBlockStack.pop_back();
  }